

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

void __thiscall BMP::writeCodesOfSymbols(BMP *this,typeOfCode type,ofstream *out)

{
  pointer pcVar1;
  ostream *poVar2;
  ofstream *poVar3;
  GreyCount *pGVar4;
  long lVar5;
  GreyCount *pGVar6;
  string title;
  char local_d9;
  uint local_d8;
  uint uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  char *local_b8;
  long local_b0;
  char local_a8 [16];
  char *local_98;
  long local_90;
  char local_88 [16];
  char *local_78;
  long local_70;
  char local_68 [24];
  char *local_50;
  long local_48;
  char local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = '\0';
  if (type < (SHANNON|HUFFMAN)) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_50,0,(char *)0x0,
               (ulong)(&DAT_0010832c + *(int *)(&DAT_0010832c + (ulong)type * 4)));
  }
  poVar3 = out;
  if (out == (ofstream *)0x0) {
    poVar3 = (ofstream *)&std::cout;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,local_50,local_48);
  lVar5 = (long)this->alphabet->num;
  if (lVar5 != 0) {
    pGVar4 = this->alphabet->symbol;
    pGVar6 = pGVar4 + lVar5;
    do {
      local_d8 = pGVar4->num;
      uStack_d4 = *(uint *)&pGVar4->tone;
      uStack_d0 = *(undefined4 *)&pGVar4->field_0x8;
      uStack_cc = *(undefined4 *)&pGVar4->field_0xc;
      local_c8 = *(undefined4 *)&pGVar4->frq;
      uStack_c4 = *(undefined4 *)((long)&pGVar4->frq + 4);
      uStack_c0 = *(undefined4 *)((long)&pGVar4->frq + 8);
      uStack_bc = *(undefined4 *)&pGVar4->field_0x1c;
      local_b8 = local_a8;
      pcVar1 = (pGVar4->uniformCodes)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar1,pcVar1 + (pGVar4->uniformCodes)._M_string_length);
      local_98 = local_88;
      pcVar1 = (pGVar4->codeShannonFano)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar1,pcVar1 + (pGVar4->codeShannonFano)._M_string_length);
      pcVar1 = (pGVar4->codeHuffman)._M_dataplus._M_p;
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,pcVar1 + (pGVar4->codeHuffman)._M_string_length);
      if (type == UNIFORM) {
        if (out == (ofstream *)0x0) {
          *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 3;
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uStack_d4 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_b8,local_b0);
          local_d9 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_d9,1);
        }
        else {
          *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,uStack_d4 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_b8,local_b0);
          local_d9 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_d9,1);
        }
      }
      else if (type == HUFFMAN) {
        if (out == (ofstream *)0x0) {
          *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 3;
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uStack_d4 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_78,local_70);
          local_d9 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_d9,1);
        }
        else {
          *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,uStack_d4 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_78,local_70);
          local_d9 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_d9,1);
        }
      }
      else if (type == SHANNON) {
        if (out == (ofstream *)0x0) {
          *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 3;
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uStack_d4 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,local_90);
          local_d9 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_d9,1);
        }
        else {
          *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,uStack_d4 & 0xff);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,local_90);
          local_d9 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_d9,1);
        }
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8);
      }
      pGVar4 = pGVar4 + 1;
    } while (pGVar4 != pGVar6);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void BMP::writeCodesOfSymbols(  typeOfCode type, std::ofstream *out ) {
    using namespace std;
    bool flag;
    if ( out != nullptr ) {
        flag = true;
    } else {
        flag = false;
    }

    string title;

    switch( type ){
        case SHANNON:
            title = "Shannon's Code of symbols: \n";
            break;
        case UNIFORM:
            title = "Uniform Code of symbols: \n";
            break;
        case HUFFMAN:
            title = "Huffman's Code of symbols: \n";
            break;
    }

    if ( flag ) {
        (*out) << title;
    } else{
        cout << title;
    }

    for_each(alphabet->symbol, alphabet->symbol+alphabet->num, [&](bitMap::GreyCount a) {
        switch (type) {
            case SHANNON:
                if (flag) {
                    (*out) << setw(3) << (int) a.tone << ": " << a.codeShannonFano << '\n';
                } else {
                    cout << setw(3) << (int) a.tone << ": " << a.codeShannonFano << '\n';
                }
                break;
            case UNIFORM:
                if (flag) {
                    (*out) << setw(3) << (int) a.tone << ": " << a.uniformCodes << '\n';
                } else {
                    cout << setw(3) << (int) a.tone << ": " << a.uniformCodes << '\n';
                };
                break;
            case HUFFMAN:
                if (flag) {
                    (*out) << setw(3) << (int) a.tone << ": " << a.codeHuffman << '\n';
                } else {
                    cout << setw(3) << (int) a.tone << ": " << a.codeHuffman << '\n';
                }
                break;
        }
    });
}